

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pagerFixMaplimit(Pager *pPager)

{
  sqlite3_file *psVar1;
  sqlite3_io_methods *psVar2;
  bool bVar3;
  sqlite3_int64 sz;
  sqlite3_int64 local_8;
  
  psVar1 = pPager->fd;
  if (psVar1->pMethods != (sqlite3_io_methods *)0x0) {
    psVar2 = psVar1->pMethods;
    if (psVar2->iVersion < 3) {
      bVar3 = false;
    }
    else {
      bVar3 = 0 < pPager->szMmap;
    }
    pPager->bUseFetch = bVar3;
    local_8 = pPager->szMmap;
    (*psVar2->xFileControl)(psVar1,0x12,&local_8);
  }
  return;
}

Assistant:

static void pagerFixMaplimit(Pager *pPager){
#if SQLITE_MAX_MMAP_SIZE>0
  sqlite3_file *fd = pPager->fd;
  if( isOpen(fd) ){
    sqlite3_int64 sz;
    pPager->bUseFetch = (fd->pMethods->iVersion>=3) && pPager->szMmap>0;
    sz = pPager->szMmap;
    sqlite3OsFileControlHint(pPager->fd, SQLITE_FCNTL_MMAP_SIZE, &sz);
  }
#endif
}